

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O2

void duckdb_je_emap_remap(tsdn_t *tsdn,emap_t *emap,edata_t *edata,szind_t szind,_Bool slab)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  void *key;
  ulong uVar4;
  undefined8 uVar5;
  rtree_leaf_elm_t *prVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  rtree_ctx_t *ctx;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  if (szind != 0xe8) {
    uVar12 = edata->e_bits;
    key = edata->e_addr;
    uVar8 = (ulong)key & 0xffffffffc0000000;
    uVar10 = (ulong)(((uint)((ulong)key >> 0x1e) & 0xf) << 4);
    puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar10);
    uVar10 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar10);
    if (uVar10 == uVar8) {
      prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + puVar1[1]);
    }
    else if (ctx->l2_cache[0].leafkey == uVar8) {
      prVar6 = ctx->l2_cache[0].leaf;
      ctx->l2_cache[0].leafkey = uVar10;
      ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
      *puVar1 = uVar8;
      puVar1[1] = (ulong)prVar6;
      prVar6 = (rtree_leaf_elm_t *)
               ((long)&(prVar6->le_bits).repr + (ulong)((uint)key >> 9 & 0x1ffff8));
    }
    else {
      for (lVar11 = 0x118; lVar11 != 0x188; lVar11 = lVar11 + 0x10) {
        if (*(ulong *)((long)ctx->cache + lVar11 + -8) == uVar8) {
          uVar7 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar11);
          puVar2 = (undefined8 *)((long)ctx->cache + lVar11 + -0x18);
          uVar5 = puVar2[1];
          puVar3 = (undefined8 *)((long)ctx->cache + lVar11 + -8);
          *puVar3 = *puVar2;
          puVar3[1] = uVar5;
          *(ulong *)((long)ctx->cache + lVar11 + -0x18) = uVar10;
          *(ulong *)((long)(ctx->cache + -1) + lVar11) = puVar1[1];
          *puVar1 = uVar8;
          puVar1[1] = uVar7;
          prVar6 = (rtree_leaf_elm_t *)(((uint)key >> 9 & 0x1ffff8) + uVar7);
          goto LAB_01f9e519;
        }
      }
      prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,ctx,(uintptr_t)key,false,true)
      ;
    }
LAB_01f9e519:
    uVar10 = (ulong)((byte)(uVar12 >> 0x2c) & 1);
    uVar12 = (ulong)((uint)(uVar12 >> 0x11) & 7);
    if (prVar6 != (rtree_leaf_elm_t *)0x0) {
      (prVar6->le_bits).repr =
           (void *)(((ulong)szind << 0x30) + uVar12 * 4 + uVar10 * 2 | (ulong)slab |
                   (ulong)edata & 0xffffffffffff);
    }
    if ((slab) && (uVar8 = (edata->field_2).e_size_esn & 0xfffffffffffff000, 0x1000 < uVar8)) {
      uVar7 = (((ulong)edata->e_addr & 0xfffffffffffff000) + uVar8) - 0x1000;
      uVar9 = uVar7 & 0xffffffffc0000000;
      uVar8 = (ulong)(((uint)(uVar7 >> 0x1e) & 0xf) << 4);
      puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar8);
      uVar8 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar8);
      if (uVar8 == uVar9) {
        prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)(uVar7 >> 9) & 0x1ffff8) + puVar1[1]);
      }
      else if (ctx->l2_cache[0].leafkey == uVar9) {
        prVar6 = ctx->l2_cache[0].leaf;
        ctx->l2_cache[0].leafkey = uVar8;
        ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
        *puVar1 = uVar9;
        puVar1[1] = (ulong)prVar6;
        prVar6 = (rtree_leaf_elm_t *)
                 ((long)&(prVar6->le_bits).repr + (ulong)((uint)uVar7 >> 9 & 0x1ffff8));
      }
      else {
        for (lVar11 = 0x118; lVar11 != 0x188; lVar11 = lVar11 + 0x10) {
          if (*(ulong *)((long)ctx->cache + lVar11 + -8) == uVar9) {
            uVar4 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar11);
            puVar2 = (undefined8 *)((long)ctx->cache + lVar11 + -0x18);
            uVar5 = puVar2[1];
            puVar3 = (undefined8 *)((long)ctx->cache + lVar11 + -8);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
            *(ulong *)((long)ctx->cache + lVar11 + -0x18) = uVar8;
            *(ulong *)((long)(ctx->cache + -1) + lVar11) = puVar1[1];
            *puVar1 = uVar9;
            puVar1[1] = uVar4;
            prVar6 = (rtree_leaf_elm_t *)(((uint)uVar7 >> 9 & 0x1ffff8) + uVar4);
            goto LAB_01f9e5b2;
          }
        }
        prVar6 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,ctx,uVar7,false,true);
      }
LAB_01f9e5b2:
      if (prVar6 != (rtree_leaf_elm_t *)0x0) {
        (prVar6->le_bits).repr =
             (void *)((((ulong)szind << 0x30) + uVar12 * 4 + uVar10 * 2 |
                      (ulong)edata & 0xfffffffffffe) + 1);
      }
    }
  }
  return;
}

Assistant:

void
emap_remap(tsdn_t *tsdn, emap_t *emap, edata_t *edata, szind_t szind,
    bool slab) {
	EMAP_DECLARE_RTREE_CTX;

	if (szind != SC_NSIZES) {
		rtree_contents_t contents;
		contents.edata = edata;
		contents.metadata.szind = szind;
		contents.metadata.slab = slab;
		contents.metadata.is_head = edata_is_head_get(edata);
		contents.metadata.state = edata_state_get(edata);

		rtree_write(tsdn, &emap->rtree, rtree_ctx,
		    (uintptr_t)edata_addr_get(edata), contents);
		/*
		 * Recall that this is called only for active->inactive and
		 * inactive->active transitions (since only active extents have
		 * meaningful values for szind and slab).  Active, non-slab
		 * extents only need to handle lookups at their head (on
		 * deallocation), so we don't bother filling in the end
		 * boundary.
		 *
		 * For slab extents, we do the end-mapping change.  This still
		 * leaves the interior unmodified; an emap_register_interior
		 * call is coming in those cases, though.
		 */
		if (slab && edata_size_get(edata) > PAGE) {
			uintptr_t key = (uintptr_t)edata_past_get(edata)
			    - (uintptr_t)PAGE;
			rtree_write(tsdn, &emap->rtree, rtree_ctx, key,
			    contents);
		}
	}
}